

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::
elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
::format(elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
         *this,log_msg *msg,tm *param_2,memory_buf_t *dest)

{
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  byte abStack_12 [5];
  undefined2 local_d;
  char local_b [3];
  char *local_8;
  
  lVar1 = (msg->time).__d.__r;
  uVar7 = lVar1 - (this->last_message_time_).__d.__r;
  uVar4 = 0;
  if (0 < (long)uVar7) {
    uVar4 = uVar7;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar4;
  uVar6 = SUB168(auVar3 * ZEXT816(0x112e0be826d694b3),8) >> 0x1a;
  (this->last_message_time_).__d.__r = lVar1;
  pcVar5 = local_b;
  uVar4 = uVar6;
  if (99999999999 < (long)uVar7) {
    do {
      uVar6 = uVar4 / 100;
      *(undefined2 *)(pcVar5 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar4 % 100) * 2);
      pcVar5 = pcVar5 + -2;
      bVar2 = 9999 < uVar4;
      uVar4 = uVar6;
    } while (bVar2);
  }
  if (uVar6 < 10) {
    pcVar5[-1] = (byte)uVar6 | 0x30;
    local_8 = pcVar5 + -1;
  }
  else {
    *(undefined2 *)(pcVar5 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + uVar6 * 2);
    local_8 = pcVar5 + -2;
  }
  ::fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_8,local_b);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto delta = (std::max)(msg.time - last_message_time_, log_clock::duration::zero());
        auto delta_units = std::chrono::duration_cast<DurationUnits>(delta);
        last_message_time_ = msg.time;
        auto delta_count = static_cast<size_t>(delta_units.count());
        auto n_digits = static_cast<size_t>(ScopedPadder::count_digits(delta_count));
        ScopedPadder p(n_digits, padinfo_, dest);
        fmt_helper::append_int(delta_count, dest);
    }